

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

void __thiscall QCalendarWidgetPrivate::_q_monthChanged(QCalendarWidgetPrivate *this,QAction *act)

{
  QCalToolButton *this_00;
  int iVar1;
  int iVar2;
  QDate date;
  long in_FS_OFFSET;
  qint64 local_58;
  QVariant local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->monthButton;
  QAction::text();
  QAbstractButton::setText((QAbstractButton *)this_00,(QString *)&local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_50);
  local_58 = (qint64)getCurrentDate(this);
  QAction::data();
  iVar1 = ::QVariant::toInt((bool *)&local_50);
  iVar2 = QDate::month(&local_58,*(undefined8 *)&this->m_model->m_calendar);
  date.jd = QDate::addMonths(&local_58,iVar1 - iVar2,*(undefined8 *)&this->m_model->m_calendar);
  ::QVariant::~QVariant(&local_50);
  updateCurrentPage(this,date);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarWidgetPrivate::_q_monthChanged(QAction *act)
{
    monthButton->setText(act->text());
    QDate currentDate = getCurrentDate();
    QDate newDate = currentDate.addMonths(act->data().toInt() - currentDate.month(m_model->m_calendar), m_model->m_calendar);
    updateCurrentPage(newDate);
}